

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

void __thiscall soplex::SPxSteepPR<double>::setRep(SPxSteepPR<double> *this,Representation param_2)

{
  int iVar1;
  int iVar2;
  SSVectorBase<double> *this_00;
  long in_RDI;
  VectorBase<double> tmp;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  SSVectorBase<double> *in_stack_ffffffffffffffb0;
  
  iVar1 = SSVectorBase<double>::dim((SSVectorBase<double> *)0x2a66e0);
  iVar2 = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2a66f4);
  if (iVar1 != iVar2) {
    VectorBase<double>::VectorBase
              ((VectorBase<double> *)in_stack_ffffffffffffffb0,
               (VectorBase<double> *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    VectorBase<double>::operator=
              ((VectorBase<double> *)in_stack_ffffffffffffffb0,
               (VectorBase<double> *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    VectorBase<double>::operator=
              ((VectorBase<double> *)in_stack_ffffffffffffffb0,
               (VectorBase<double> *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    SSVectorBase<double>::clear(in_stack_ffffffffffffffb0);
    this_00 = (SSVectorBase<double> *)(in_RDI + 0x38);
    SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2a6783);
    SSVectorBase<double>::reDim(this_00,in_stack_ffffffffffffffac);
    VectorBase<double>::~VectorBase((VectorBase<double> *)0x2a67a3);
  }
  return;
}

Assistant:

void SPxSteepPR<R>::setRep(typename SPxSolverBase<R>::Representation)
{
   if(workVec.dim() != this->thesolver->dim())
   {
      VectorBase<R> tmp = this->thesolver->weights;
      this->thesolver->weights = this->thesolver->coWeights;
      this->thesolver->coWeights = tmp;

      workVec.clear();
      workVec.reDim(this->thesolver->dim());
   }
}